

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

void Js::CrossSite::MarshalPrototypeChain(ScriptContext *scriptContext,DynamicObject *object)

{
  TypeId TVar1;
  int iVar2;
  BOOL BVar3;
  DynamicObject *object_00;
  ScriptContext *pSVar4;
  bool bVar5;
  DynamicObject *prototypeObject;
  RecyclableObject *prototype;
  DynamicObject *object_local;
  ScriptContext *scriptContext_local;
  
  prototypeObject = (DynamicObject *)RecyclableObject::GetPrototype(&object->super_RecyclableObject)
  ;
  while( true ) {
    TVar1 = RecyclableObject::GetTypeId(&prototypeObject->super_RecyclableObject);
    bVar5 = false;
    if (TVar1 != TypeIds_Null) {
      TVar1 = RecyclableObject::GetTypeId(&prototypeObject->super_RecyclableObject);
      bVar5 = TVar1 != TypeIds_HostDispatch;
    }
    if (!bVar5) {
      return;
    }
    object_00 = VarTo<Js::DynamicObject,Js::RecyclableObject>
                          (&prototypeObject->super_RecyclableObject);
    iVar2 = (*(object_00->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])();
    if (iVar2 != 0) {
      return;
    }
    pSVar4 = RecyclableObject::GetScriptContext(&object_00->super_RecyclableObject);
    if ((scriptContext != pSVar4) &&
       (BVar3 = RecyclableObject::IsExternal(&object_00->super_RecyclableObject), BVar3 == 0)) {
      MarshalDynamicObject(scriptContext,object_00);
    }
    bVar5 = VarIs<Js::JavascriptProxy,Js::DynamicObject>(object_00);
    if (bVar5) break;
    prototypeObject =
         (DynamicObject *)RecyclableObject::GetPrototype(&object_00->super_RecyclableObject);
  }
  return;
}

Assistant:

void CrossSite::MarshalPrototypeChain(ScriptContext* scriptContext, DynamicObject * object)
    {
        RecyclableObject * prototype = object->GetPrototype();
        while (prototype->GetTypeId() != TypeIds_Null && prototype->GetTypeId() != TypeIds_HostDispatch)
        {
            // We should not see any static type or host dispatch here
            DynamicObject * prototypeObject = VarTo<DynamicObject>(prototype);
            if (prototypeObject->IsCrossSiteObject())
            {
                break;
            }
            if (scriptContext != prototypeObject->GetScriptContext() && !prototypeObject->IsExternal())
            {
                MarshalDynamicObject(scriptContext, prototypeObject);
            }
            if (VarIs<JavascriptProxy>(prototypeObject))
            {
                // Fetching prototype of proxy can invoke trap - which we don't want during the marshalling time.
                break;
            }
            prototype = prototypeObject->GetPrototype();
        }
    }